

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

char * getResult(char *func,list *tokens,list *output)

{
  token **pptVar1;
  OPCODE OVar2;
  list *plVar3;
  _Bool _Var4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  char *str;
  long lVar8;
  token *ptVar9;
  char *__s;
  list **list;
  uint uVar10;
  token *ptVar11;
  token *node;
  double dVar12;
  list *result_list;
  list *operators;
  double local_80;
  list *local_78;
  list *local_70;
  list *local_68;
  list *local_60;
  char *local_58;
  list *local_50;
  double local_48;
  
  local_58 = (char *)malloc_(0x20);
  uVar10 = 0;
  inside_def = false;
  parenthesis_warning = false;
  initList(&local_50);
  tokenize(tokens,func);
  plVar3 = local_50;
  ptVar11 = tokens->first;
  ptVar9 = ptVar11;
  if (ptVar11 != (token *)0x0) {
    do {
      if (ptVar9->opcode == OP_Closed_parenthesis) {
        uVar10 = uVar10 - 1;
      }
      else if (ptVar9->opcode == OP_Open_parenthesis) {
        uVar10 = uVar10 + 1;
      }
      pptVar1 = &ptVar9->next;
      ptVar9 = *pptVar1;
    } while (*pptVar1 != (token *)0x0);
    uVar10 = (uint)(uVar10 != 0);
  }
  parenthesis_warning = SUB41(uVar10,0);
  local_70 = local_50;
  division_warning = false;
  trigonometric_warning = false;
  local_68 = output;
  if ((ptVar11 != (token *)0x0) && (parenthesis_warning == false)) {
    do {
      OVar2 = ptVar11->opcode;
      if (OVar2 == OP_Open_parenthesis) goto LAB_001048e1;
      if (OVar2 == OP_Closed_parenthesis) {
        local_78 = plVar3;
        local_60 = output;
        while (ptVar9 = plVar3->last, ptVar9 != (token *)0x0) {
          pcVar7 = ptVar9->value;
          iVar5 = strcmp(pcVar7,"(");
          if (iVar5 == 0) {
            if (plVar3->first == ptVar9) {
              plVar3->first = (token *)0x0;
            }
            plVar3->last = ptVar9->prev;
            free(pcVar7);
            free(ptVar9);
            break;
          }
          moveToken(&local_60,&local_78);
        }
      }
      else {
        _Var4 = isFunction(OVar2);
        if (_Var4) {
LAB_001048e1:
          list = &local_70;
        }
        else {
          _Var4 = isOperator(ptVar11->opcode);
          if (_Var4) {
            while (ptVar9 = plVar3->last, ptVar9 != (token *)0x0) {
              iVar5 = getPrec(ptVar11->opcode);
              iVar6 = getPrec(ptVar9->opcode);
              if (iVar5 < iVar6) break;
              moveToken(&local_68,&local_70);
            }
            goto LAB_001048e1;
          }
          list = &local_68;
        }
        push(list,ptVar11);
      }
      ptVar11 = ptVar11->next;
    } while ((ptVar11 != (token *)0x0) && ((parenthesis_warning & 1U) == 0));
  }
  if (plVar3->last != (token *)0x0) {
    do {
      moveToken(&local_68,&local_70);
    } while (plVar3->last != (token *)0x0);
  }
  ptVar11 = output->first;
  initList(&local_78);
  if (ptVar11 != (token *)0x0) {
    do {
      _Var4 = isOperator(ptVar11->opcode);
      if (((!_Var4) && (_Var4 = isFunction(ptVar11->opcode), !_Var4)) &&
         (_Var4 = isDataUnit(ptVar11->opcode), !_Var4)) {
        push(&local_78,ptVar11);
        goto LAB_00104ca6;
      }
      plVar3 = local_78;
      local_60 = local_78;
      if ((local_78 == (list *)0x0) || (local_78->last == (token *)0x0)) goto LAB_00104ca6;
      pcVar7 = pop(local_78);
      _Var4 = isFunction(ptVar11->opcode);
      if ((_Var4) || (_Var4 = isDataUnit(ptVar11->opcode), _Var4)) {
        str = (char *)0x0;
      }
      else {
        str = pop(plVar3);
      }
      OVar2 = ptVar11->opcode;
      inside_def = OVar2 == OP_Equal;
      if (inside_def) {
        dVar12 = getValue(pcVar7);
        addVariable(str,dVar12);
LAB_00104a6c:
        local_80 = 0.0;
        goto LAB_00104c2d;
      }
      local_80 = getValue(str);
      dVar12 = getValue(pcVar7);
      if (-1 < (long)precision) {
        local_48 = dVar12;
        local_80 = round_(local_80,(long)precision);
        dVar12 = round_(local_48,(long)precision);
      }
      switch(OVar2) {
      case OP_Plus:
        local_80 = local_80 + dVar12;
        break;
      case OP_Minus:
        local_80 = local_80 - dVar12;
        break;
      case OP_Multi:
        local_80 = local_80 * dVar12;
        break;
      case OP_Div:
        if ((dVar12 == 0.0) && (!NAN(dVar12))) {
          division_warning = true;
          goto LAB_00104a6c;
        }
        local_80 = local_80 / dVar12;
        break;
      default:
        if ((degree == true) &&
           (local_48 = dVar12, _Var4 = isTrigonometric(OVar2), dVar12 = local_48, _Var4)) {
          dVar12 = (local_48 / 180.0) * 3.141592653589793;
        }
        if (OVar2 == OP_Tan) {
          local_80 = tan(dVar12);
        }
        else if (OVar2 == OP_Cos) {
          local_80 = cos(dVar12);
        }
        else if (OVar2 == OP_Sin) {
          local_80 = sin(dVar12);
        }
        else {
          if ((OVar2 - OP_Asin < 3) && (1.0 < ABS(dVar12))) {
            trigonometric_warning = true;
            goto LAB_00104a6c;
          }
          if (OVar2 == OP_Atan) {
            local_80 = atan(dVar12);
          }
          else if (OVar2 == OP_Acos) {
            local_80 = acos(dVar12);
          }
          else {
            local_80 = 0.0;
            if (OVar2 == OP_Asin) {
              local_80 = asin(dVar12);
            }
          }
        }
        break;
      case OP_Pow:
        local_80 = pow(local_80,dVar12);
        break;
      case OP_Fact:
        lVar8 = fact((long)(int)dVar12);
        local_80 = (double)lVar8;
        break;
      case OP_Sqrt:
        if (dVar12 < 0.0) {
          local_80 = sqrt(dVar12);
        }
        else {
          local_80 = SQRT(dVar12);
        }
        break;
      case OP_Abs:
        local_80 = ABS(dVar12);
        break;
      case OP_Log:
        local_80 = log(dVar12);
        break;
      case OP_Floor:
        local_80 = floor(dVar12);
        break;
      case OP_Ceil:
        local_80 = ceil(dVar12);
        break;
      case OP_Round:
        local_80 = round(dVar12);
        break;
      case OP_Rand:
        local_80 = getRand();
        break;
      case OP_Mb:
        local_80 = dVar12 * 1024.0;
        break;
      case OP_Gb:
        goto LAB_00104c21;
      case OP_Tb:
        goto LAB_00104c1d;
      case OP_Pb:
        dVar12 = dVar12 * 1024.0;
LAB_00104c1d:
        dVar12 = dVar12 * 1024.0;
LAB_00104c21:
        local_80 = dVar12 * 1024.0 * 1024.0;
      }
LAB_00104c2d:
      if (-1 < (long)precision) {
        local_80 = round_(local_80,(long)precision);
      }
      ptVar9 = (token *)malloc_(0x20);
      __s = (char *)malloc_(0x20);
      ptVar9->value = __s;
      snprintf(__s,0x20,"%.15g",local_80);
      push(&local_60,ptVar9);
      free(ptVar9->value);
      free(ptVar9);
      free(pcVar7);
      if (str != (char *)0x0) {
        free(str);
      }
LAB_00104ca6:
      ptVar11 = ptVar11->next;
    } while (ptVar11 != (token *)0x0);
  }
  pcVar7 = local_58;
  dVar12 = 0.0;
  if ((local_78 != (list *)0x0) && (local_78->last != (token *)0x0)) {
    dVar12 = getValue(local_78->last->value);
  }
  if (-1 < (long)result_precision) {
    dVar12 = round_(dVar12,(long)result_precision);
  }
  freeList(local_78);
  snprintf(pcVar7,0x20,"%.15g",dVar12);
  freeList(local_50);
  if (inside_def == true) {
    free(pcVar7);
    pcVar7 = (char *)0x0;
  }
  return pcVar7;
}

Assistant:

char *getResult(const char *func, struct list *tokens, struct list *output)
{
    struct list *operators;
    char *result = malloc_(BUFFER);
    inside_def = false;
    parenthesis_warning = false;

    initList(&operators);

    tokenize(tokens, func);
    validateParenthesis(tokens);
    infixToPostfix(tokens, output, operators);
    snprintf(result, BUFFER, NUMBER_FORMAT, getPostfixResult(output));
    freeList(operators);

    if (inside_def) {
        free(result);
        return NULL;
    }

    return result;
}